

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

lyd_node * lyd_create_leaf(lys_node *schema,char *val_str,int dflt)

{
  int iVar1;
  hash_table *phVar2;
  char *local_40;
  lyd_node_leaf_list *ret;
  int dflt_local;
  char *val_str_local;
  lys_node *schema_local;
  
  schema_local = (lys_node *)calloc(1,0x50);
  if (schema_local == (lys_node *)0x0) {
    ly_log(schema->module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_create_leaf"
          );
    schema_local = (lys_node *)0x0;
  }
  else {
    schema_local->name = (char *)schema;
    iVar1 = ly_new_node_validity(schema);
    *(uint8_t *)&schema_local->dsc = (uint8_t)iVar1;
    iVar1 = resolve_applies_when(schema,0,(lys_node *)0x0);
    if (iVar1 != 0) {
      *(byte *)((long)&schema_local->dsc + 1) = *(byte *)((long)&schema_local->dsc + 1) & 0xf1 | 8;
    }
    schema_local->ext = (lys_ext_instance **)schema_local;
    *(undefined4 *)&schema_local->child = *(undefined4 *)&schema[1].ref;
    local_40 = val_str;
    if (val_str == (char *)0x0) {
      local_40 = "";
    }
    phVar2 = (hash_table *)lydict_insert(schema->module->ctx,local_40,0);
    *(hash_table **)&schema_local->nodetype = phVar2;
    *(byte *)((long)&schema_local->dsc + 1) =
         *(byte *)((long)&schema_local->dsc + 1) & 0xfe | (byte)dflt & 1;
    lyd_hash((lyd_node *)schema_local);
  }
  return (lyd_node *)schema_local;
}

Assistant:

static struct lyd_node *
lyd_create_leaf(const struct lys_node *schema, const char *val_str, int dflt)
{
    struct lyd_node_leaf_list *ret;

    ret = calloc(1, sizeof *ret);
    LY_CHECK_ERR_RETURN(!ret, LOGMEM(schema->module->ctx), NULL);

    ret->schema = (struct lys_node *)schema;
    ret->validity = ly_new_node_validity(schema);
    if (resolve_applies_when(schema, 0, NULL)) {
        ret->when_status = LYD_WHEN;
    }
    ret->prev = (struct lyd_node *)ret;
    ret->value_type = ((struct lys_node_leaf *)schema)->type.base;
    ret->value_str = lydict_insert(schema->module->ctx, val_str ? val_str : "", 0);
    ret->dflt = dflt;

#ifdef LY_ENABLED_CACHE
    lyd_hash((struct lyd_node *)ret);
#endif

    return (struct lyd_node *)ret;
}